

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

uint __thiscall crnlib::dxt_image::get_selector(dxt_image *this,uint x,uint y,uint element_index)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  dxt3_block *this_00;
  
  if (this->m_element_type[element_index] - cColorDXT1 < 4) {
    this_00 = (dxt3_block *)
              (this->m_pElements +
              (((y >> 2) * this->m_blocks_x + (x >> 2)) * this->m_num_elements_per_block +
              element_index));
    switch(this->m_element_type[element_index]) {
    case cColorDXT1:
      return this_00->m_alpha[(ulong)(y & 3) + 4] >> ((char)x * '\x02' & 6U) & 3;
    case cAlphaDXT3:
      uVar5 = dxt3_block::get_alpha(this_00,x & 3,y & 3,false);
      return uVar5;
    case cColorETC1:
      iVar2 = (y & 3) + (x & 1) * 4;
      uVar6 = (ulong)(((int)(x << 0x1e) >> 0x1f) + 7);
      return (uint)*(byte *)((long)&g_etc1_to_selector_index +
                            (ulong)((uint)((this_00->m_alpha[uVar6] >> iVar2 & 1) != 0) +
                                   (this_00->m_alpha[uVar6 - 2] >> (sbyte)iVar2 & 1) * 2));
    }
    uVar1 = (x & 3) + (y & 3) * 4;
    uVar3 = uVar1 * 3;
    uVar6 = (ulong)(uVar3 >> 3);
    uVar4 = (uint)this_00->m_alpha[uVar6 + 2];
    if (uVar1 < 0xe) {
      uVar4 = (uint)CONCAT11(this_00->m_alpha[uVar6 + 3],this_00->m_alpha[uVar6 + 2]);
    }
    return uVar4 >> ((byte)uVar3 & 7) & 7;
  }
  return 0;
}

Assistant:

uint dxt_image::get_selector(uint x, uint y, uint element_index) const
    {
        CRNLIB_ASSERT((x < m_width) && (y < m_height));

        const uint block_x = x >> cDXTBlockShift;
        const uint block_y = y >> cDXTBlockShift;

        const element& block = get_element(block_x, block_y, element_index);

        switch (m_element_type[element_index])
        {
        case cColorETC1:
        {
            const etc1_block& src_block = *reinterpret_cast<const etc1_block*>(&block);
            return src_block.get_selector(x & 3, y & 3);
        }
        case cColorDXT1:
        {
            const dxt1_block& block1 = *reinterpret_cast<const dxt1_block*>(&block);
            return block1.get_selector(x & 3, y & 3);
        }
        case cAlphaDXT5:
        {
            const dxt5_block& block5 = *reinterpret_cast<const dxt5_block*>(&block);
            return block5.get_selector(x & 3, y & 3);
        }
        case cAlphaDXT3:
        {
            const dxt3_block& block3 = *reinterpret_cast<const dxt3_block*>(&block);
            return block3.get_alpha(x & 3, y & 3, false);
        }
        default:
            break;
        }

        return 0;
    }